

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleTargetMode(cmSetPropertyCommand *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  reference pbVar3;
  cmTarget *target_00;
  ostream *poVar4;
  string local_200;
  ostringstream local_1e0 [8];
  ostringstream e;
  cmTarget *target;
  allocator local_49;
  string local_48;
  _Self local_28;
  _Self local_20;
  const_iterator ni;
  cmSetPropertyCommand *this_local;
  
  ni._M_node = (_Base_ptr)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->Names);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->Names);
    bVar2 = std::operator!=(&local_20,&local_28);
    if (!bVar2) {
      return true;
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    pbVar3 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_20);
    bVar2 = cmMakefile::IsAlias(pcVar1,pbVar3);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_48,"can not be used on an ALIAS target.",&local_49);
      cmCommand::SetError(&this->super_cmCommand,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      return false;
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    pbVar3 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_20);
    target_00 = cmMakefile::FindTargetToUse(pcVar1,pbVar3,false);
    if (target_00 == (cmTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_1e0);
      poVar4 = std::operator<<((ostream *)local_1e0,"could not find TARGET ");
      pbVar3 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      poVar4 = std::operator<<(poVar4,(string *)pbVar3);
      std::operator<<(poVar4,".  Perhaps it has not yet been created.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::ostringstream::~ostringstream(local_1e0);
      return false;
    }
    bVar2 = HandleTarget(this,target_00);
    if (!bVar2) break;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_20);
  }
  return false;
}

Assistant:

bool cmSetPropertyCommand::HandleTargetMode()
{
  for(std::set<std::string>::const_iterator ni = this->Names.begin();
      ni != this->Names.end(); ++ni)
    {
    if (this->Makefile->IsAlias(*ni))
      {
      this->SetError("can not be used on an ALIAS target.");
      return false;
      }
    if(cmTarget* target = this->Makefile->FindTargetToUse(*ni))
      {
      // Handle the current target.
      if(!this->HandleTarget(target))
        {
        return false;
        }
      }
    else
      {
      std::ostringstream e;
      e << "could not find TARGET " << *ni
        << ".  Perhaps it has not yet been created.";
      this->SetError(e.str());
      return false;
      }
    }
  return true;
}